

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

int mxx::scatter_one<int>(vector<int,_std::allocator<int>_> *msgs,int root,comm *comm)

{
  int iVar1;
  size_type sVar2;
  const_reference msgs_00;
  int local_24;
  comm *pcStack_20;
  int result;
  comm *comm_local;
  vector<int,_std::allocator<int>_> *pvStack_10;
  int root_local;
  vector<int,_std::allocator<int>_> *msgs_local;
  
  pcStack_20 = comm;
  comm_local._4_4_ = root;
  pvStack_10 = msgs;
  iVar1 = mxx::comm::rank(comm);
  if (iVar1 == comm_local._4_4_) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(pvStack_10);
    iVar1 = mxx::comm::size(pcStack_20);
    if (sVar2 != (long)iVar1) {
      assert_fail("comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                  ,0xfe,"scatter_one");
    }
  }
  msgs_00 = std::vector<int,_std::allocator<int>_>::operator[](pvStack_10,0);
  scatter<int>(msgs_00,1,&local_24,comm_local._4_4_,pcStack_20);
  return local_24;
}

Assistant:

T scatter_one(const std::vector<T>& msgs, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size()));
    T result;
    scatter(&msgs[0], 1, &result, root, comm);
    return result;
}